

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteTables(CWriter *this)

{
  string_view name;
  bool bVar1;
  size_type sVar2;
  vector<wabt::Table_*,_std::allocator<wabt::Table_*>_> *this_00;
  reference ppTVar3;
  string local_60;
  undefined1 local_39;
  Table *pTStack_38;
  bool is_import;
  Table *table;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Table_*,_std::allocator<wabt::Table_*>_> *__range2;
  Index table_index;
  CWriter *this_local;
  
  sVar2 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size(&this->module_->tables);
  if (sVar2 != this->module_->num_table_imports) {
    __range2._4_4_ = 0;
    this_00 = &this->module_->tables;
    __end2 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::begin(this_00);
    table = (Table *)std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wabt::Table_*const_*,_std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>_>
                                       *)&table), bVar1) {
      ppTVar3 = __gnu_cxx::
                __normal_iterator<wabt::Table_*const_*,_std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>_>
                ::operator*(&__end2);
      pTStack_38 = *ppTVar3;
      local_39 = __range2._4_4_ < this->module_->num_table_imports;
      if (!(bool)local_39) {
        name = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)pTStack_38);
        (anonymous_namespace)::CWriter::DefineInstanceMemberName_abi_cxx11_
                  (&local_60,(CWriter *)this,Table,name);
        WriteTable(this,&local_60,&pTStack_38->elem_type);
        std::__cxx11::string::~string((string *)&local_60);
        Write(this);
      }
      __range2._4_4_ = __range2._4_4_ + 1;
      __gnu_cxx::
      __normal_iterator<wabt::Table_*const_*,_std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void CWriter::WriteTables() {
  if (module_->tables.size() == module_->num_table_imports) {
    return;
  }

  Index table_index = 0;
  for (const Table* table : module_->tables) {
    bool is_import = table_index < module_->num_table_imports;
    if (!is_import) {
      WriteTable(DefineInstanceMemberName(ModuleFieldType::Table, table->name),
                 table->elem_type);
      Write(Newline());
    }
    ++table_index;
  }
}